

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ray.h
# Opt level: O0

Vector * __thiscall Ray::point(Vector *__return_storage_ptr__,Ray *this,double t)

{
  Vector local_38;
  double local_20;
  double t_local;
  Ray *this_local;
  
  local_20 = t;
  t_local = (double)this;
  this_local = (Ray *)__return_storage_ptr__;
  operator*(&local_38,&this->dir,t);
  operator+(__return_storage_ptr__,&this->org,&local_38);
  return __return_storage_ptr__;
}

Assistant:

Vector point( double t ) { return org + dir * t; }